

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

AGLTexture * aGLTextureCreate(AGLTexture *__return_storage_ptr__,AGLTextureData *data)

{
  GLenum error;
  AGLTextureMinFilter AVar1;
  
  __return_storage_ptr__->type = data->type;
  __return_storage_ptr__->format = AGLTF_Unknown;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->depth = 0;
  AVar1 = AGLTmF_LinearMipLinear;
  if ((data->flags & 1) == 0) {
    AVar1 = AGLTmF_Linear;
  }
  __return_storage_ptr__->min_filter = AVar1;
  __return_storage_ptr__->mag_filter = AGLTMF_Linear;
  __return_storage_ptr__->wrap_s = AGLTW_Repeat;
  __return_storage_ptr__->wrap_t = 0;
  (__return_storage_ptr__->_).name = 0;
  (__return_storage_ptr__->_).wrap_s = 0xffffffff;
  (__return_storage_ptr__->_).wrap_t = 0;
  (__return_storage_ptr__->_).min_filter = 0xffffffff;
  (__return_storage_ptr__->_).mag_filter = 0xffffffff;
  glGenTextures(1,&__return_storage_ptr__->_);
  error = glGetError();
  if (error == 0) {
    aGLTextureUpdate(__return_storage_ptr__,data);
    return __return_storage_ptr__;
  }
  a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:923: glGenTextures(1, &tex._.name) returned "
                  ,error);
  abort();
}

Assistant:

AGLTexture aGLTextureCreate(const AGLTextureData *data) {
	AGLTexture tex = {
		.type = data->type,
		.format = AGLTF_Unknown,
		._.mag_filter = tex._.min_filter = (GLenum)-1,
		._.wrap_s = tex._.wrap_t = (GLenum)-1,
		.mag_filter = AGLTMF_Linear,
		.min_filter = (data->flags & AGLTUF_GenerateMipmaps)
			? AGLTmF_LinearMipLinear
			: AGLTmF_Linear,
		.wrap_s = tex.wrap_t = AGLTW_Repeat,
	};

	AGL__CALL(glGenTextures(1, &tex._.name));
	aGLTextureUpdate(&tex, data);
	return tex;
}